

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

char __thiscall Fl_Help_View::extend_selection(Fl_Help_View *this)

{
  int iVar1;
  int iVar2;
  Window WVar3;
  int iVar4;
  Fl_Surface_Device *pFVar5;
  Fl_Display_Device *pFVar6;
  Fl_Surface_Device *_ss;
  Window _sw;
  int sl;
  int sf;
  Fl_Help_View *this_local;
  
  iVar4 = Fl::event_is_click();
  iVar2 = selection_last;
  iVar1 = selection_first;
  if (iVar4 == 0) {
    selected = 1;
    mouse_x = Fl::event_x();
    mouse_y = Fl::event_y();
    WVar3 = fl_window;
    draw_mode = 2;
    fl_window = fl_help_view_buffer;
    pFVar5 = Fl_Surface_Device::surface();
    pFVar6 = Fl_Display_Device::display_device();
    (*(pFVar6->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
    fl_push_no_clip();
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[2])();
    fl_pop_clip();
    fl_window = WVar3;
    (*(pFVar5->super_Fl_Device)._vptr_Fl_Device[3])();
    draw_mode = 0;
    if (selection_push_first < selection_drag_first) {
      selection_first = selection_push_first;
    }
    else {
      selection_first = selection_drag_first;
    }
    if (selection_drag_last < selection_push_last) {
      selection_last = selection_push_last;
    }
    else {
      selection_last = selection_drag_last;
    }
    if ((iVar1 == selection_first) && (iVar2 == selection_last)) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

char Fl_Help_View::extend_selection()
{
  if (Fl::event_is_click())
    return 0;

//  printf("old selection_first=%d, selection_last=%d\n",
//         selection_first, selection_last);

  int sf = selection_first, sl = selection_last;

  selected = 1;
  mouse_x = Fl::event_x();
  mouse_y = Fl::event_y();
  draw_mode = 2;

    fl_begin_offscreen(fl_help_view_buffer);
    draw();
    fl_end_offscreen();

  draw_mode = 0;

  if (selection_push_first < selection_drag_first) {
    selection_first = selection_push_first;
  } else {
    selection_first = selection_drag_first;
  }

  if (selection_push_last > selection_drag_last) {
    selection_last = selection_push_last;
  } else {
    selection_last = selection_drag_last;
  }

//  printf("new selection_first=%d, selection_last=%d\n",
//         selection_first, selection_last);

  if (sf!=selection_first || sl!=selection_last) {
//    puts("REDRAW!!!\n");
    return 1;
  } else {
//    puts("");
    return 0;
  }
}